

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTest.cpp
# Opt level: O3

void __thiscall Microsoft::VisualStudio::CppUnitTestFramework::JITTest::JITAddFunc(JITTest *this)

{
  int iVar1;
  Func fn;
  int result;
  JitRuntime rt;
  X86Assembler as;
  CodeHolder code;
  code *local_2c8;
  int local_2c0;
  int local_2bc;
  undefined1 local_2b8 [152];
  X86Assembler local_220;
  CodeHolder local_168;
  
  ::asmjit::JitRuntime::JitRuntime((JitRuntime *)local_2b8);
  ::asmjit::CodeHolder::CodeHolder(&local_168);
  ::asmjit::CodeHolder::init(&local_168,(EVP_PKEY_CTX *)(local_2b8 + 8));
  ::asmjit::X86Assembler::X86Assembler(&local_220,&local_168);
  ::asmjit::CodeEmitter::emit
            ((CodeEmitter *)&local_220,0x189,(Operand_ *)(::asmjit::x86OpData + 0x480),
             (Operand_ *)(::asmjit::x86OpData + 0x4e0));
  ::asmjit::CodeEmitter::emit
            ((CodeEmitter *)&local_220,7,(Operand_ *)(::asmjit::x86OpData + 0x480),
             (Operand_ *)(::asmjit::x86OpData + 0x4f0));
  ::asmjit::CodeEmitter::emit((CodeEmitter *)&local_220,0x276);
  iVar1 = (**(_func_int **)(local_2b8._0_8_ + 0x10))(local_2b8,&local_2c8,&local_168);
  if (iVar1 != 0) {
    Assert::Fail(L"Failed to compile the code.");
  }
  local_2bc = (*local_2c8)(100,200);
  local_2c0 = 300;
  Assert::AreEqual<int>(&local_2bc,&local_2c0,(wchar_t *)0x0);
  (**(_func_int **)(local_2b8._0_8_ + 0x18))((JitRuntime *)local_2b8,local_2c8);
  ::asmjit::X86Assembler::~X86Assembler(&local_220);
  ::asmjit::CodeHolder::~CodeHolder(&local_168);
  ::asmjit::JitRuntime::~JitRuntime((JitRuntime *)local_2b8);
  return;
}

Assistant:

TEST_METHOD(JITAddFunc)
		{
			typedef int (*Func)(int a, int b);

			using namespace asmjit;

			JitRuntime rt;

			CodeHolder code;
			code.init(rt.getCodeInfo());

			X86Assembler as(&code);

#if defined(CENTAURUS_BUILD_WINDOWS)
			as.mov(x86::rax, x86::rcx);
			as.add(x86::rax, x86::rdx);
#elif defined(CENTAURUS_BUILD_LINUX)
            as.mov(x86::rax, x86::rsi);
            as.add(x86::rax, x86::rdi);
#endif
			as.ret();

			Func fn;

			Error err = rt.add(&fn, &code);

			if (err) Assert::Fail(L"Failed to compile the code.");

			int result = fn(100, 200);

			Assert::AreEqual(result, 300);

			rt.release(fn);
		}